

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_EndPolling
                  (PaAlsaStreamComponent *self,pollfd *pfds,int *shouldPoll,int *xrun)

{
  int iVar1;
  int iVar2;
  PaError PVar3;
  undefined8 in_RAX;
  pthread_t __thread1;
  char *errorText;
  unsigned_short revents;
  
  revents = (unsigned_short)((ulong)in_RAX >> 0x30);
  iVar1 = snd_pcm_poll_descriptors_revents(self->pcm,pfds,self->nfds,&revents);
  if (iVar1 < 0) {
    __thread1 = pthread_self();
    iVar2 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar2 != 0) {
      errorText = (char *)snd_strerror(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_poll_descriptors_revents( self->pcm, pfds, self->nfds, &revents )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3654\n"
                     );
    PVar3 = -9999;
  }
  else if (revents == 0) {
    PVar3 = 0;
    if (self->useReventFix != 0) {
      self->ready = 1;
      *shouldPoll = 0;
      PVar3 = 0;
    }
  }
  else {
    if (((revents & 8) == 0) && ((revents & 0x10) == 0)) {
      self->ready = 1;
    }
    else {
      *xrun = 1;
    }
    *shouldPoll = 0;
    PVar3 = 0;
  }
  return PVar3;
}

Assistant:

static PaError PaAlsaStreamComponent_EndPolling( PaAlsaStreamComponent* self, struct pollfd* pfds, int* shouldPoll, int* xrun )
{
    PaError result = paNoError;
    unsigned short revents;

    ENSURE_( alsa_snd_pcm_poll_descriptors_revents( self->pcm, pfds, self->nfds, &revents ), paUnanticipatedHostError );
    if( revents != 0 )
    {
        if( revents & POLLERR )
        {
            *xrun = 1;
        }
        else if( revents & POLLHUP )
        {
            *xrun = 1;
            PA_DEBUG(( "%s: revents has POLLHUP, processing as XRUN\n", __FUNCTION__ ));
        }
        else
            self->ready = 1;

        *shouldPoll = 0;
    }
    else /* (A zero revent occurred) */
        /* Work around an issue with Alsa older than 1.0.16 using some plugins (eg default with plug + dmix) where
         * POLLIN or POLLOUT are zeroed by Alsa-lib if _mmap_avail() is a few frames short of avail_min at period
         * boundary, possibly due to erratic dma interrupts at period boundary?  Treat as a valid event.
         */
        if( self->useReventFix )
        {
            self->ready = 1;
            *shouldPoll = 0;
        }

error:
    return result;
}